

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

TaprootSpendData * __thiscall
TaprootBuilder::GetSpendData(TaprootSpendData *__return_storage_ptr__,TaprootBuilder *this)

{
  _Rb_tree_header *p_Var1;
  uint256 *puVar2;
  pointer poVar3;
  pointer poVar4;
  pointer pLVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  base_blob<256U> *pbVar10;
  bool bVar11;
  _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  *this_00;
  long lVar12;
  ptrdiff_t _Num;
  size_t __n;
  pointer __x;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> control_block;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  key_type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_valid == true) {
    poVar3 = (this->m_branch).
             super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)(this->m_branch).
                   super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)poVar3 >> 6;
    if ((lVar12 == 0) ||
       ((lVar12 == 1 &&
        (*(bool *)((long)&(poVar3->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false> +
                  0x38) != false)))) {
      bVar11 = XOnlyPubKey::IsFullyValid(&this->m_output_key);
      if (!bVar11) {
        __assert_fail("m_output_key.IsFullyValid()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/signingprovider.cpp"
                      ,0x195,"TaprootSpendData TaprootBuilder::GetSpendData() const");
      }
      p_Var1 = &(__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _S_red;
      (__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
      local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      puVar2 = &(__return_storage_ptr__->internal_key).m_keydata;
      (puVar2->super_base_blob<256U>).m_data._M_elems[0] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[1] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[2] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[3] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[4] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[5] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[6] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[7] = '\0';
      pbVar10 = &(__return_storage_ptr__->internal_key).m_keydata.super_base_blob<256U>;
      (pbVar10->m_data)._M_elems[8] = '\0';
      (pbVar10->m_data)._M_elems[9] = '\0';
      (pbVar10->m_data)._M_elems[10] = '\0';
      (pbVar10->m_data)._M_elems[0xb] = '\0';
      (pbVar10->m_data)._M_elems[0xc] = '\0';
      (pbVar10->m_data)._M_elems[0xd] = '\0';
      (pbVar10->m_data)._M_elems[0xe] = '\0';
      (pbVar10->m_data)._M_elems[0xf] = '\0';
      pbVar10 = &(__return_storage_ptr__->internal_key).m_keydata.super_base_blob<256U>;
      (pbVar10->m_data)._M_elems[0x10] = '\0';
      (pbVar10->m_data)._M_elems[0x11] = '\0';
      (pbVar10->m_data)._M_elems[0x12] = '\0';
      (pbVar10->m_data)._M_elems[0x13] = '\0';
      (pbVar10->m_data)._M_elems[0x14] = '\0';
      (pbVar10->m_data)._M_elems[0x15] = '\0';
      (pbVar10->m_data)._M_elems[0x16] = '\0';
      (pbVar10->m_data)._M_elems[0x17] = '\0';
      pbVar10 = &(__return_storage_ptr__->internal_key).m_keydata.super_base_blob<256U>;
      (pbVar10->m_data)._M_elems[0x18] = '\0';
      (pbVar10->m_data)._M_elems[0x19] = '\0';
      (pbVar10->m_data)._M_elems[0x1a] = '\0';
      (pbVar10->m_data)._M_elems[0x1b] = '\0';
      (pbVar10->m_data)._M_elems[0x1c] = '\0';
      (pbVar10->m_data)._M_elems[0x1d] = '\0';
      (pbVar10->m_data)._M_elems[0x1e] = '\0';
      (pbVar10->m_data)._M_elems[0x1f] = '\0';
      puVar2 = &__return_storage_ptr__->merkle_root;
      (puVar2->super_base_blob<256U>).m_data._M_elems[0] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[1] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[2] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[3] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[4] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[5] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[6] = '\0';
      (puVar2->super_base_blob<256U>).m_data._M_elems[7] = '\0';
      pbVar10 = &(__return_storage_ptr__->merkle_root).super_base_blob<256U>;
      (pbVar10->m_data)._M_elems[8] = '\0';
      (pbVar10->m_data)._M_elems[9] = '\0';
      (pbVar10->m_data)._M_elems[10] = '\0';
      (pbVar10->m_data)._M_elems[0xb] = '\0';
      (pbVar10->m_data)._M_elems[0xc] = '\0';
      (pbVar10->m_data)._M_elems[0xd] = '\0';
      (pbVar10->m_data)._M_elems[0xe] = '\0';
      (pbVar10->m_data)._M_elems[0xf] = '\0';
      pbVar10 = &(__return_storage_ptr__->merkle_root).super_base_blob<256U>;
      (pbVar10->m_data)._M_elems[0x10] = '\0';
      (pbVar10->m_data)._M_elems[0x11] = '\0';
      (pbVar10->m_data)._M_elems[0x12] = '\0';
      (pbVar10->m_data)._M_elems[0x13] = '\0';
      (pbVar10->m_data)._M_elems[0x14] = '\0';
      (pbVar10->m_data)._M_elems[0x15] = '\0';
      (pbVar10->m_data)._M_elems[0x16] = '\0';
      (pbVar10->m_data)._M_elems[0x17] = '\0';
      pbVar10 = &(__return_storage_ptr__->merkle_root).super_base_blob<256U>;
      (pbVar10->m_data)._M_elems[0x18] = '\0';
      (pbVar10->m_data)._M_elems[0x19] = '\0';
      (pbVar10->m_data)._M_elems[0x1a] = '\0';
      (pbVar10->m_data)._M_elems[0x1b] = '\0';
      (pbVar10->m_data)._M_elems[0x1c] = '\0';
      (pbVar10->m_data)._M_elems[0x1d] = '\0';
      (pbVar10->m_data)._M_elems[0x1e] = '\0';
      (pbVar10->m_data)._M_elems[0x1f] = '\0';
      (__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      poVar3 = (this->m_branch).
               super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar4 = (this->m_branch).
               super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (poVar4 == poVar3) {
        local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.second = 0;
        local_58._28_4_ = 0;
      }
      else {
        local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             *(undefined4 *)
              &(poVar3->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>)._M_payload.
               super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
               super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload;
        local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ =
             *(undefined4 *)
              ((long)&(poVar3->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                      _M_payload.
                      super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
                      super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload + 4);
        local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ =
             *(undefined4 *)
              ((long)&(poVar3->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                      _M_payload.
                      super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
                      super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload + 8);
        local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             *(undefined4 *)
              ((long)&(poVar3->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                      _M_payload.
                      super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
                      super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload + 0xc);
        local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              ((long)&(poVar3->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                      _M_payload.
                      super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
                      super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload + 0x10);
        local_58._24_8_ =
             *(undefined8 *)
              ((long)&(poVar3->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                      _M_payload.
                      super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
                      super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload + 0x18);
      }
      *(pointer *)
       ((__return_storage_ptr__->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10) =
           local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      *(undefined8 *)
       ((__return_storage_ptr__->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18) =
           local_58._24_8_;
      *(ulong *)(__return_storage_ptr__->merkle_root).super_base_blob<256U>.m_data._M_elems =
           CONCAT44(local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_);
      *(ulong *)((__return_storage_ptr__->merkle_root).super_base_blob<256U>.m_data._M_elems + 8) =
           CONCAT44(local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                    local_58.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_4_);
      uVar7 = *(undefined8 *)(this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems;
      uVar8 = *(undefined8 *)
               ((this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8);
      uVar9 = *(undefined8 *)
               ((this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)
       ((__return_storage_ptr__->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems +
       0x10) = *(undefined8 *)
                ((this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)
       ((__return_storage_ptr__->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems +
       0x18) = uVar9;
      *(undefined8 *)
       (__return_storage_ptr__->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems =
           uVar7;
      *(undefined8 *)
       ((__return_storage_ptr__->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8)
           = uVar8;
      if (poVar4 != poVar3) {
        __x = *(pointer *)
               &(poVar3->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>)._M_payload.
                super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
                super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload._M_value.leaves.
                super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
                ._M_impl;
        pLVar5 = *(pointer *)
                  ((long)&(poVar3->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
                          super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload._M_value
                          .leaves.
                          super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
                  + 8);
        if (__x != pLVar5) {
          do {
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (byte *)0x0;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_78,
                       (long)*(pointer *)
                              ((long)&(__x->merkle_branch).
                                      super__Vector_base<uint256,_std::allocator<uint256>_> + 8) +
                       (0x21 - *(long *)&(__x->merkle_branch).
                                         super__Vector_base<uint256,_std::allocator<uint256>_>.
                                         _M_impl));
            *local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start = this->m_parity | (byte)__x->leaf_version;
            uVar7 = *(undefined8 *)
                     (this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems;
            uVar8 = *(undefined8 *)
                     ((this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8);
            uVar9 = *(undefined8 *)
                     ((this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18)
            ;
            *(undefined8 *)
             (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x11) =
                 *(undefined8 *)
                  ((this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10);
            *(undefined8 *)
             (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x19) = uVar9;
            *(undefined8 *)
             (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 1) = uVar7;
            *(undefined8 *)
             (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 9) = uVar8;
            pvVar6 = *(void **)&(__x->merkle_branch).
                                super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl;
            __n = (long)*(pointer *)
                         ((long)&(__x->merkle_branch).
                                 super__Vector_base<uint256,_std::allocator<uint256>_> + 8) -
                  (long)pvVar6;
            if (__n != 0) {
              memmove(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x21,pvVar6,__n);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&local_58.first,&__x->script);
            local_58.second = __x->leaf_version;
            this_00 = (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       *)std::
                         map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                         ::operator[](&__return_storage_ptr__->scripts,&local_58);
            std::
            _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ::_M_insert_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      (this_00,&local_78);
            pvVar6 = (void *)CONCAT44(local_58.first.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_58.first.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_);
            if (pvVar6 != (void *)0x0) {
              operator_delete(pvVar6,(long)local_58.first.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar6);
            }
            if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            __x = __x + 1;
          } while (__x != pLVar5);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
  }
  __assert_fail("IsComplete()",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/signingprovider.cpp"
                ,0x194,"TaprootSpendData TaprootBuilder::GetSpendData() const");
}

Assistant:

TaprootSpendData TaprootBuilder::GetSpendData() const
{
    assert(IsComplete());
    assert(m_output_key.IsFullyValid());
    TaprootSpendData spd;
    spd.merkle_root = m_branch.size() == 0 ? uint256() : m_branch[0]->hash;
    spd.internal_key = m_internal_key;
    if (m_branch.size()) {
        // If any script paths exist, they have been combined into the root m_branch[0]
        // by now. Compute the control block for each of its tracked leaves, and put them in
        // spd.scripts.
        for (const auto& leaf : m_branch[0]->leaves) {
            std::vector<unsigned char> control_block;
            control_block.resize(TAPROOT_CONTROL_BASE_SIZE + TAPROOT_CONTROL_NODE_SIZE * leaf.merkle_branch.size());
            control_block[0] = leaf.leaf_version | (m_parity ? 1 : 0);
            std::copy(m_internal_key.begin(), m_internal_key.end(), control_block.begin() + 1);
            if (leaf.merkle_branch.size()) {
                std::copy(leaf.merkle_branch[0].begin(),
                          leaf.merkle_branch[0].begin() + TAPROOT_CONTROL_NODE_SIZE * leaf.merkle_branch.size(),
                          control_block.begin() + TAPROOT_CONTROL_BASE_SIZE);
            }
            spd.scripts[{leaf.script, leaf.leaf_version}].insert(std::move(control_block));
        }
    }
    return spd;
}